

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bdflib.c
# Opt level: O1

FT_Error bdf_list_split_(bdf_list_t_ *list,char *separators,char *line,unsigned_long linelen)

{
  byte bVar1;
  unsigned_long uVar2;
  bool bVar3;
  FT_Error FVar4;
  char *pcVar5;
  ulong uVar6;
  byte *pbVar7;
  ulong uVar8;
  byte *pbVar9;
  char seps [32];
  byte local_58 [40];
  
  list->used = 0;
  if (list->size != 0) {
    *list->field = "";
    list->field[1] = "";
    list->field[2] = "";
    list->field[3] = "";
    list->field[4] = "";
  }
  if (linelen == 0) {
    return 0;
  }
  if (*line == '\0') {
    return 0;
  }
  if (separators == (char *)0x0) {
    return 6;
  }
  if (*separators == '\0') {
    return 6;
  }
  local_58[0x10] = 0;
  local_58[0x11] = 0;
  local_58[0x12] = 0;
  local_58[0x13] = 0;
  local_58[0x14] = 0;
  local_58[0x15] = 0;
  local_58[0x16] = 0;
  local_58[0x17] = 0;
  local_58[0x18] = 0;
  local_58[0x19] = 0;
  local_58[0x1a] = 0;
  local_58[0x1b] = 0;
  local_58[0x1c] = 0;
  local_58[0x1d] = 0;
  local_58[0x1e] = 0;
  local_58[0x1f] = 0;
  local_58[0] = 0;
  local_58[1] = 0;
  local_58[2] = 0;
  local_58[3] = 0;
  local_58[4] = 0;
  local_58[5] = 0;
  local_58[6] = 0;
  local_58[7] = 0;
  local_58[8] = 0;
  local_58[9] = 0;
  local_58[10] = 0;
  local_58[0xb] = 0;
  local_58[0xc] = 0;
  local_58[0xd] = 0;
  local_58[0xe] = 0;
  local_58[0xf] = 0;
  pcVar5 = separators + 1;
  bVar3 = false;
  do {
    bVar1 = pcVar5[-1];
    if (bVar1 == 0x2b) {
      if (*pcVar5 != '\0') goto LAB_00221280;
      bVar3 = true;
    }
    else {
      if (bVar1 == 0) {
        if (((long)linelen < 1) || (*line == '\0')) {
          uVar8 = 0;
        }
        else {
          pbVar9 = (byte *)(line + linelen);
          do {
            bVar1 = *line;
            pbVar7 = (byte *)line;
            while ((bVar1 != 0 && ((local_58[bVar1 >> 3] >> (bVar1 & 7) & 1) == 0))) {
              bVar1 = pbVar7[1];
              pbVar7 = pbVar7 + 1;
            }
            if ((list->used == list->size) &&
               (FVar4 = bdf_list_ensure_(list,list->used + 1), FVar4 != 0)) {
              return FVar4;
            }
            if (pbVar7 <= line) {
              line = "";
            }
            uVar2 = list->used;
            list->used = uVar2 + 1;
            list->field[uVar2] = line;
            bVar1 = *pbVar7;
            line = (char *)pbVar7;
            if (bVar3) {
              while ((bVar1 != 0 && ((local_58[bVar1 >> 3] >> (bVar1 & 7) & 1) != 0))) {
                *line = 0;
                bVar1 = ((byte *)line)[1];
                line = (char *)((byte *)line + 1);
              }
            }
            else if (bVar1 != 0) {
              line = (char *)(pbVar7 + 1);
              *pbVar7 = 0;
            }
            if (pbVar7 < line) {
              uVar8 = (ulong)(*line == 0);
            }
            else {
              uVar8 = 0;
            }
          } while ((line < pbVar9) && (*line != 0));
        }
        uVar6 = list->used + uVar8;
        if ((uVar6 < list->size) || (FVar4 = bdf_list_ensure_(list,uVar6 + 1), FVar4 == 0)) {
          if (uVar8 != 0) {
            uVar2 = list->used;
            list->used = uVar2 + 1;
            list->field[uVar2] = "";
          }
          list->field[list->used] = (char *)0x0;
          FVar4 = 0;
        }
        return FVar4;
      }
LAB_00221280:
      local_58[bVar1 >> 3] = local_58[bVar1 >> 3] | '\x01' << (bVar1 & 7);
    }
    pcVar5 = pcVar5 + 1;
  } while( true );
}

Assistant:

static FT_Error
  bdf_list_split_( bdf_list_t_*   list,
                   const char*    separators,
                   char*          line,
                   unsigned long  linelen )
  {
    unsigned long  final_empty;
    int            mult;
    const char     *sp, *end;
    char           *ep;
    char           seps[32];
    FT_Error       error = FT_Err_Ok;


    /* Initialize the list. */
    list->used = 0;
    if ( list->size )
    {
      list->field[0] = (char*)empty;
      list->field[1] = (char*)empty;
      list->field[2] = (char*)empty;
      list->field[3] = (char*)empty;
      list->field[4] = (char*)empty;
    }

    /* If the line is empty, then simply return. */
    if ( linelen == 0 || line[0] == 0 )
      goto Exit;

    /* In the original code, if the `separators' parameter is NULL or */
    /* empty, the list is split into individual bytes.  We don't need */
    /* this, so an error is signaled.                                 */
    if ( separators == NULL || *separators == 0 )
    {
      error = FT_THROW( Invalid_Argument );
      goto Exit;
    }

    /* Prepare the separator bitmap. */
    FT_MEM_ZERO( seps, 32 );

    /* If the very last character of the separator string is a plus, then */
    /* set the `mult' flag to indicate that multiple separators should be */
    /* collapsed into one.                                                */
    for ( mult = 0, sp = separators; sp && *sp; sp++ )
    {
      if ( *sp == '+' && *( sp + 1 ) == 0 )
        mult = 1;
      else
        setsbit( seps, *sp );
    }

    /* Break the line up into fields. */
    for ( final_empty = 0, sp = ep = line, end = sp + linelen;
          sp < end && *sp; )
    {
      /* Collect everything that is not a separator. */
      for ( ; *ep && !sbitset( seps, *ep ); ep++ )
        ;

      /* Resize the list if necessary. */
      if ( list->used == list->size )
      {
        error = bdf_list_ensure_( list, list->used + 1 );
        if ( error )
          goto Exit;
      }

      /* Assign the field appropriately. */
      list->field[list->used++] = ( ep > sp ) ? (char*)sp : (char*)empty;

      sp = ep;

      if ( mult )
      {
        /* If multiple separators should be collapsed, do it now by */
        /* setting all the separator characters to 0.               */
        for ( ; *ep && sbitset( seps, *ep ); ep++ )
          *ep = 0;
      }
      else if ( *ep != 0 )
        /* Don't collapse multiple separators by making them 0, so just */
        /* make the one encountered 0.                                  */
        *ep++ = 0;

      final_empty = ( ep > sp && *ep == 0 );
      sp = ep;
    }

    /* Finally, NULL-terminate the list. */
    if ( list->used + final_empty >= list->size )
    {
      error = bdf_list_ensure_( list, list->used + final_empty + 1 );
      if ( error )
        goto Exit;
    }

    if ( final_empty )
      list->field[list->used++] = (char*)empty;

    list->field[list->used] = NULL;

  Exit:
    return error;
  }